

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall efsw::String::append(String *this,char *s,size_t n)

{
  String tmp;
  String local_30;
  
  String(&local_30,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_append(&this->mString,local_30.mString._M_dataplus._M_p,local_30.mString._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.mString._M_dataplus._M_p != &local_30.mString.field_2) {
    operator_delete(local_30.mString._M_dataplus._M_p);
  }
  return this;
}

Assistant:

String& String::append( const char* s, size_t n ) {
	String tmp( s );

	mString.append( tmp.mString );

	return *this;
}